

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall kj::anon_unknown_36::WebSocketImpl::setUpSendingControlMessage(WebSocketImpl *this)

{
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 *paVar1;
  bool bVar2;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar3;
  long lVar4;
  OwnPromiseNode node;
  void *pvVar5;
  PromiseNode *ptrCopy;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 *dependencyParam;
  TransformPromiseNodeBase *this_00;
  OwnPromiseNode local_58;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_50;
  undefined *local_48;
  undefined1 *local_40;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 local_38;
  
  bVar2 = (this->sendingControlMessage).ptr.isSet;
  paVar1 = &(this->sendingControlMessage).ptr.field_1;
  dependencyParam = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 *)0x0;
  if (bVar2 != false) {
    dependencyParam = paVar1;
  }
  if (bVar2 == true) {
    aVar3.value.super_PromiseBase.node.ptr = *(Promise<void> *)dependencyParam;
    lVar4 = *(long *)((long)aVar3 + 8);
    if (lVar4 == 0 || (ulong)((long)aVar3 - lVar4) < 0x28) {
      pvVar5 = operator_new(0x400);
      this_00 = (TransformPromiseNodeBase *)((long)pvVar5 + 0x3d8);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&dependencyParam->value,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3660:44)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)pvVar5 + 0x3d8) = &PTR_destroy_0063eca8;
      *(WebSocketImpl **)((long)pvVar5 + 0x3f8) = this;
      *(void **)((long)pvVar5 + 0x3e0) = pvVar5;
    }
    else {
      *(undefined8 *)((long)aVar3 + 8) = 0;
      this_00 = (TransformPromiseNodeBase *)((long)aVar3 + -0x28);
      kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                (this_00,(OwnPromiseNode *)&dependencyParam->value,
                 kj::_::
                 SimpleTransformPromiseNode<void,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++:3660:44)>
                 ::anon_class_8_1_8991fb9c_for_func::operator());
      *(undefined ***)((long)aVar3 + -0x28) = &PTR_destroy_0063eca8;
      *(WebSocketImpl **)((long)aVar3 + -8) = this;
      *(long *)((long)aVar3 + -0x20) = lVar4;
    }
    local_50 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)&DAT_004a8171;
    local_48 = &DAT_004a81d0;
    local_40 = &DAT_4c0000058b;
    local_58.ptr = &this_00->super_PromiseNode;
    kj::_::PromiseDisposer::
    appendPromise<kj::_::ChainPromiseNode,kj::_::PromiseDisposer,kj::SourceLocation&>
              ((PromiseDisposer *)&local_38.value,&local_58,(SourceLocation *)&local_50.value);
    node.ptr = local_58.ptr;
    if ((TransformPromiseNodeBase *)local_58.ptr != (TransformPromiseNodeBase *)0x0) {
      local_58.ptr = (PromiseNode *)0x0;
      kj::_::PromiseDisposer::dispose(&(node.ptr)->super_PromiseArenaMember);
    }
    if ((this->sendingControlMessage).ptr.isSet == true) {
      (this->sendingControlMessage).ptr.isSet = false;
      aVar3 = (this->sendingControlMessage).ptr.field_1;
      if (aVar3 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
        *paVar1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar3);
      }
    }
    (this->sendingControlMessage).ptr.field_1 = local_38;
  }
  else {
    writeQueuedControlMessage((WebSocketImpl *)&local_50.value);
    if ((this->sendingControlMessage).ptr.isSet == true) {
      (this->sendingControlMessage).ptr.isSet = false;
      aVar3 = (this->sendingControlMessage).ptr.field_1;
      if (aVar3 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
        *paVar1 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar3);
      }
    }
    (this->sendingControlMessage).ptr.field_1 = local_50;
  }
  (this->sendingControlMessage).ptr.isSet = true;
  return;
}

Assistant:

void setUpSendingControlMessage() {
    KJ_IF_SOME(promise, sendingControlMessage) {
      sendingControlMessage = promise.then([this]() mutable {
        return writeQueuedControlMessage();
      });
    } else {
      sendingControlMessage = writeQueuedControlMessage();
    }
  }